

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O2

__m256 * __thiscall
Sphere::intersect(__m256 *__return_storage_ptr__,Sphere *this,Ray8 *ray,DiffGeom8 *dg)

{
  Sphere SVar1;
  Sphere SVar2;
  bool bVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  __m256 *pafVar12;
  __m256 *extraout_RAX;
  ulong uVar13;
  __m256 afVar14;
  undefined1 auVar15 [32];
  undefined4 uVar17;
  undefined1 auVar18 [16];
  __m256 c;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  __m256 b;
  undefined1 auVar28 [32];
  __m256 t1;
  __m256 t0;
  Vec3f_8 point;
  __m256 in_stack_fffffffffffffe80;
  __m256 t;
  __m256 local_100;
  __m256 local_e0;
  Vec3f_8 local_c0;
  undefined1 auVar16 [32];
  
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(*__return_storage_ptr__ + 2);
  fVar23 = (*__return_storage_ptr__)[4];
  b[1] = fVar23;
  b[0] = fVar23;
  b[2] = fVar23;
  b[3] = fVar23;
  b[4] = fVar23;
  b[5] = fVar23;
  b[6] = fVar23;
  b[7] = fVar23;
  SVar1 = this[4];
  SVar2 = this[5];
  uVar17 = (undefined4)*(ulong *)(*__return_storage_ptr__ + 2);
  auVar19._4_4_ = uVar17;
  auVar19._0_4_ = uVar17;
  auVar19._8_4_ = uVar17;
  auVar19._12_4_ = uVar17;
  auVar19._16_4_ = uVar17;
  auVar19._20_4_ = uVar17;
  auVar19._24_4_ = uVar17;
  auVar19._28_4_ = uVar17;
  auVar16 = vsubps_avx(auVar19,(undefined1  [32])*this);
  auVar18 = vmovshdup_avx(auVar18);
  c._0_8_ = auVar18._0_8_;
  c[2] = (float)(int)c._0_8_;
  c[3] = (float)(int)((ulong)c._0_8_ >> 0x20);
  c[4] = (float)(int)c._0_8_;
  c[5] = (float)(int)((ulong)c._0_8_ >> 0x20);
  c[6] = (float)(int)c._0_8_;
  c[7] = (float)(int)((ulong)c._0_8_ >> 0x20);
  auVar15 = vsubps_avx((undefined1  [32])c,(undefined1  [32])this[1]);
  auVar20 = vsubps_avx((undefined1  [32])b,(undefined1  [32])this[2]);
  fVar23 = *(float *)&this[3].super_Geometry._vptr_Geometry;
  fVar24 = *(float *)((long)&this[3].super_Geometry._vptr_Geometry + 4);
  fVar25 = this[3].pos.x;
  fVar26 = this[3].pos.y;
  fVar27 = this[3].pos.z;
  fVar10 = this[3].radius;
  fVar11 = (float)this[3].material_id;
  auVar4._4_4_ = fVar24 * fVar24;
  auVar4._0_4_ = fVar23 * fVar23;
  auVar4._8_4_ = fVar25 * fVar25;
  auVar4._12_4_ = fVar26 * fVar26;
  auVar4._16_4_ = fVar27 * fVar27;
  auVar4._20_4_ = fVar10 * fVar10;
  auVar4._24_4_ = fVar11 * fVar11;
  auVar4._28_4_ = auVar18._4_4_;
  fVar21 = auVar16._0_4_;
  fVar22 = auVar16._4_4_;
  auVar5._4_4_ = fVar22 * fVar24;
  auVar5._0_4_ = fVar21 * fVar23;
  fVar23 = auVar16._8_4_;
  auVar5._8_4_ = fVar23 * fVar25;
  fVar24 = auVar16._12_4_;
  auVar5._12_4_ = fVar24 * fVar26;
  fVar25 = auVar16._16_4_;
  auVar5._16_4_ = fVar25 * fVar27;
  fVar26 = auVar16._20_4_;
  auVar5._20_4_ = fVar26 * fVar10;
  fVar27 = auVar16._24_4_;
  auVar5._24_4_ = fVar27 * fVar11;
  auVar5._28_4_ = *(undefined4 *)&this[3].field_0x1c;
  auVar9._4_4_ = fVar22 * fVar22;
  auVar9._0_4_ = fVar21 * fVar21;
  auVar9._8_4_ = fVar23 * fVar23;
  auVar9._12_4_ = fVar24 * fVar24;
  auVar9._16_4_ = fVar25 * fVar25;
  auVar9._20_4_ = fVar26 * fVar26;
  auVar9._24_4_ = fVar27 * fVar27;
  auVar9._28_4_ = auVar16._28_4_;
  auVar18 = vfmadd231ps_fma(auVar5,auVar15,(undefined1  [32])SVar1);
  auVar7 = vfmadd231ps_fma(auVar4,(undefined1  [32])SVar1,(undefined1  [32])SVar1);
  fVar23 = (*__return_storage_ptr__)[5];
  auVar28._4_4_ = fVar23;
  auVar28._0_4_ = fVar23;
  auVar28._8_4_ = fVar23;
  auVar28._12_4_ = fVar23;
  auVar28._16_4_ = fVar23;
  auVar28._20_4_ = fVar23;
  auVar28._24_4_ = fVar23;
  auVar28._28_4_ = fVar23;
  auVar8 = vfmadd231ps_fma(auVar9,auVar15,auVar15);
  local_100 = (__m256)(ZEXT832(0) << 0x20);
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar20,(undefined1  [32])SVar2);
  auVar15._8_4_ = 0xc0000000;
  auVar15._0_8_ = 0xc0000000c0000000;
  auVar15._12_4_ = 0xc0000000;
  auVar15._16_4_ = 0xc0000000;
  auVar15._20_4_ = 0xc0000000;
  auVar15._24_4_ = 0xc0000000;
  auVar15._28_4_ = 0xc0000000;
  vmulps_avx512vl(ZEXT1632(auVar18),auVar15);
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar20,auVar20);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),(undefined1  [32])SVar2,(undefined1  [32])SVar2);
  auVar16 = ZEXT1632(auVar7);
  vfnmadd231ps_fma(ZEXT1632(auVar18),auVar28,auVar28);
  local_e0 = local_100;
  pafVar12 = solve_quadratic(&local_e0,in_stack_fffffffffffffe80,b,c,&local_100,(__m256 *)ray);
  uVar13 = vcmpps_avx512vl((undefined1  [32])local_e0,(undefined1  [32])this[6],1);
  bVar3 = (bool)((byte)uVar13 & 1);
  afVar14[0] = (uint)bVar3 * (int)local_100[0] | (uint)!bVar3 * (int)local_e0[0];
  bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
  afVar14[1] = (uint)bVar3 * (int)local_100[1] | (uint)!bVar3 * (int)local_e0[1];
  bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
  afVar14[2] = (uint)bVar3 * (int)local_100[2] | (uint)!bVar3 * (int)local_e0[2];
  bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
  afVar14[3] = (uint)bVar3 * (int)local_100[3] | (uint)!bVar3 * (int)local_e0[3];
  bVar3 = (bool)((byte)(uVar13 >> 4) & 1);
  afVar14[4] = (uint)bVar3 * (int)local_100[4] | (uint)!bVar3 * (int)local_e0[4];
  bVar3 = (bool)((byte)(uVar13 >> 5) & 1);
  afVar14[5] = (uint)bVar3 * (int)local_100[5] | (uint)!bVar3 * (int)local_e0[5];
  bVar3 = (bool)((byte)(uVar13 >> 6) & 1);
  afVar14[6] = (uint)bVar3 * (int)local_100[6] | (uint)!bVar3 * (int)local_e0[6];
  bVar3 = SUB81(uVar13 >> 7,0);
  afVar14[7] = (float)((uint)bVar3 * (int)local_100[7] | (uint)!bVar3 * (int)local_e0[7]);
  uVar13 = vcmpps_avx512vl((undefined1  [32])afVar14,(undefined1  [32])this[7],1);
  uVar6 = vcmpps_avx512vl((undefined1  [32])this[6],(undefined1  [32])afVar14,1);
  uVar13 = uVar13 & uVar6;
  auVar15 = vmovdqa32_avx512vl(auVar16);
  auVar16._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar15._4_4_;
  auVar16._0_4_ = (uint)((byte)uVar13 & 1) * auVar15._0_4_;
  auVar16._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar15._8_4_;
  auVar16._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar15._12_4_;
  auVar16._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar15._16_4_;
  auVar16._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar15._20_4_;
  auVar16._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar15._24_4_;
  auVar16._28_4_ = (uint)(byte)(uVar13 >> 7) * auVar15._28_4_;
  t = (__m256)vpand_avx2(auVar16,(undefined1  [32])this[8]);
  auVar16 = (undefined1  [32])this[8] & auVar16;
  if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0x7f,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar16 >> 0xbf,0) != '\0') ||
      (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0') {
    SVar1 = (Sphere)vblendvps_avx((undefined1  [32])this[7],(undefined1  [32])afVar14,
                                  (undefined1  [32])t);
    this[7] = SVar1;
    local_e0 = afVar14;
    Ray8::at(&local_c0,(Ray8 *)this,t);
    auVar16 = *(undefined1 (*) [32])(ray->d).x;
    auVar15 = vblendvps_avx(*(undefined1 (*) [32])(ray->o).x,(undefined1  [32])local_c0.x,
                            (undefined1  [32])t);
    auVar20 = vsubps_avx((undefined1  [32])local_c0.x,auVar19);
    *(undefined1 (*) [32])(ray->o).x = auVar15;
    auVar15 = vblendvps_avx(*(undefined1 (*) [32])(ray->o).y,(undefined1  [32])local_c0.y,
                            (undefined1  [32])t);
    auVar4 = vsubps_avx((undefined1  [32])local_c0.y,(undefined1  [32])c);
    *(undefined1 (*) [32])(ray->o).y = auVar15;
    auVar15 = vblendvps_avx(*(undefined1 (*) [32])(ray->o).z,(undefined1  [32])local_c0.z,
                            (undefined1  [32])t);
    auVar5 = vsubps_avx((undefined1  [32])local_c0.z,(undefined1  [32])b);
    *(undefined1 (*) [32])(ray->o).z = auVar15;
    auVar16 = vblendvps_avx(auVar16,auVar20,(undefined1  [32])t);
    *(undefined1 (*) [32])(ray->d).x = auVar16;
    auVar16 = vblendvps_avx(*(undefined1 (*) [32])(ray->d).y,auVar4,(undefined1  [32])t);
    *(undefined1 (*) [32])(ray->d).y = auVar16;
    auVar16 = vblendvps_avx(*(undefined1 (*) [32])(ray->d).z,auVar5,(undefined1  [32])t);
    *(undefined1 (*) [32])(ray->d).z = auVar16;
    Vec3f_8::normalize(&ray->d);
    fVar23 = (*__return_storage_ptr__)[6];
    auVar20._4_4_ = fVar23;
    auVar20._0_4_ = fVar23;
    auVar20._8_4_ = fVar23;
    auVar20._12_4_ = fVar23;
    auVar20._16_4_ = fVar23;
    auVar20._20_4_ = fVar23;
    auVar20._24_4_ = fVar23;
    auVar20._28_4_ = fVar23;
    auVar16 = vblendvps_avx(*(undefined1 (*) [32])ray->t_min,auVar20,(undefined1  [32])t);
    *(undefined1 (*) [32])ray->t_min = auVar16;
    pafVar12 = extraout_RAX;
  }
  return pafVar12;
}

Assistant:

__m256 Sphere::intersect(Ray8 &ray, DiffGeom8 &dg) const {
	const auto center = Vec3f_8{pos};
	const auto d = center - ray.o;
	const auto a = ray.d.length_sqr();
	const auto b = _mm256_mul_ps(ray.d.dot(d), _mm256_set1_ps(-2.f));
	const auto c = _mm256_fnmadd_ps(_mm256_set1_ps(radius), _mm256_set1_ps(radius), d.dot(d));
	// Solve the quadratic equation and store the mask of potential hits
	// We'll update this mask as we discard other potential hits, eg. due to
	// the hit being beyond the ray's t value
	auto t0 = _mm256_set1_ps(0);
	auto t1 = _mm256_set1_ps(0);
	auto hits = solve_quadratic(a, b, c, t0, t1);
	// We want t0 to hold the nearest t value that is greater than ray.t_min
	auto swap_t = _mm256_cmp_ps(t0, ray.t_min, _CMP_LT_OQ);
	t0 = _mm256_blendv_ps(t0, t1, swap_t);
	// Check which hits are within the ray's t range
	auto in_range = _mm256_and_ps(_mm256_cmp_ps(t0, ray.t_min, _CMP_GT_OQ),
			_mm256_cmp_ps(t0, ray.t_max, _CMP_LT_OQ));
	hits = _mm256_and_ps(hits, in_range);
	hits = _mm256_and_ps(hits, ray.active);
	// Check if all rays miss the sphere
	if (_mm256_movemask_ps(hits) == 0){
		return hits;
	}
	// Update t values for rays that did hit
	ray.t_max = _mm256_blendv_ps(ray.t_max, t0, hits);

	const auto point = ray.at(ray.t_max);
	dg.point.x = _mm256_blendv_ps(dg.point.x, point.x, hits);
	dg.point.y = _mm256_blendv_ps(dg.point.y, point.y, hits);
	dg.point.z = _mm256_blendv_ps(dg.point.z, point.z, hits);
	const auto normal = point - center;
	dg.normal.x = _mm256_blendv_ps(dg.normal.x, normal.x, hits);
	dg.normal.y = _mm256_blendv_ps(dg.normal.y, normal.y, hits);
	dg.normal.z = _mm256_blendv_ps(dg.normal.z, normal.z, hits);
	dg.normal.normalize();
	// There's no blendv_epi32 in AVX/AVX2 so we have to resort to some hacky casting
	dg.material_id = _mm256_castps_si256(_mm256_blendv_ps(_mm256_castsi256_ps(dg.material_id),
			_mm256_castsi256_ps(_mm256_set1_epi32(material_id)), hits));
	return hits;
}